

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

Float __thiscall pbrt::AtomicFloat::operator=(AtomicFloat *this,float v)

{
  __atomic_base<unsigned_int> *in_RDI;
  Float in_XMM0_Da;
  
  FloatToBits(0.0);
  std::__atomic_base<unsigned_int>::operator=(in_RDI,(__int_type_conflict1)in_XMM0_Da);
  return in_XMM0_Da;
}

Assistant:

PBRT_CPU_GPU
    Float operator=(float v) {
#ifdef PBRT_IS_GPU_CODE
        value = v;
        return value;
#else
        bits = FloatToBits(v);
        return v;
#endif
    }